

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# write_batch.cc
# Opt level: O1

Status __thiscall leveldb::WriteBatch::Iterate(WriteBatch *this,Handler *handler)

{
  char cVar1;
  bool bVar2;
  Slice *msg2;
  long *in_RDX;
  Slice *msg;
  int iVar3;
  long in_FS_OFFSET;
  Slice value;
  Slice key;
  Slice input;
  Slice local_88;
  Slice local_78;
  Slice local_68;
  Slice local_58;
  Slice local_48;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  local_48.data_ = (char *)handler->_vptr_Handler;
  local_48.size_ = (size_t)handler[1]._vptr_Handler;
  if (local_48.size_ < (_func_int **)0xc) {
    msg = &local_58;
    local_58.data_ = "malformed WriteBatch (too small)";
    local_58.size_ = 0x20;
    msg2 = &local_68;
    local_68.data_ = "";
    local_68.size_ = 0;
  }
  else {
    local_48.data_ = (char *)((long)local_48.data_ + 0xc);
    iVar3 = 0;
    local_58.data_ = "";
    local_58.size_ = 0;
    local_68.data_ = "";
    local_68.size_ = 0;
    local_48.size_ = local_48.size_ - 0xc;
    if ((_func_int **)local_48.size_ != (_func_int **)0x0) {
      iVar3 = 0;
      do {
        cVar1 = *local_48.data_;
        local_48.data_ = (char *)((long)local_48.data_ + 1);
        local_48.size_ = local_48.size_ - 1;
        if (cVar1 != '\0') {
          if (cVar1 == '\x01') {
            bVar2 = GetLengthPrefixedSlice(&local_48,&local_58);
            if (bVar2) {
              bVar2 = GetLengthPrefixedSlice(&local_48,&local_68);
              if (bVar2) {
                (**(code **)(*in_RDX + 0x10))();
                goto LAB_0067ff01;
              }
            }
            local_78.data_ = "bad WriteBatch Put";
            local_78.size_ = 0x12;
          }
          else {
            local_78.data_ = "unknown WriteBatch tag";
            local_78.size_ = 0x16;
          }
          goto LAB_0067ff88;
        }
        bVar2 = GetLengthPrefixedSlice(&local_48,&local_58);
        if (!bVar2) {
          local_78.data_ = "bad WriteBatch Delete";
          local_78.size_ = 0x15;
          goto LAB_0067ff88;
        }
        (**(code **)(*in_RDX + 0x18))();
LAB_0067ff01:
        iVar3 = iVar3 + 1;
      } while ((_func_int **)local_48.size_ != (_func_int **)0x0);
    }
    if (iVar3 == *(int *)(handler->_vptr_Handler + 1)) {
      (this->rep_)._M_dataplus._M_p = (pointer)0x0;
      goto LAB_0067ffb1;
    }
    local_78.data_ = "WriteBatch has wrong count";
    local_78.size_ = 0x1a;
LAB_0067ff88:
    msg = &local_78;
    msg2 = &local_88;
    local_88.data_ = "";
    local_88.size_ = 0;
  }
  Status::Status((Status *)this,kCorruption,msg,msg2);
LAB_0067ffb1:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (Status)(char *)this;
  }
  __stack_chk_fail();
}

Assistant:

Status WriteBatch::Iterate(Handler* handler) const {
  Slice input(rep_);
  if (input.size() < kHeader) {
    return Status::Corruption("malformed WriteBatch (too small)");
  }

  input.remove_prefix(kHeader);
  Slice key, value;
  int found = 0;
  while (!input.empty()) {
    found++;
    char tag = input[0];
    input.remove_prefix(1);
    switch (tag) {
      case kTypeValue:
        if (GetLengthPrefixedSlice(&input, &key) &&
            GetLengthPrefixedSlice(&input, &value)) {
          handler->Put(key, value);
        } else {
          return Status::Corruption("bad WriteBatch Put");
        }
        break;
      case kTypeDeletion:
        if (GetLengthPrefixedSlice(&input, &key)) {
          handler->Delete(key);
        } else {
          return Status::Corruption("bad WriteBatch Delete");
        }
        break;
      default:
        return Status::Corruption("unknown WriteBatch tag");
    }
  }
  if (found != WriteBatchInternal::Count(this)) {
    return Status::Corruption("WriteBatch has wrong count");
  } else {
    return Status::OK();
  }
}